

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harvest.cc
# Opt level: O0

double sptk::world::anon_unknown_2::SelectBestF0
                 (double reference_f0,double *f0_candidates,int number_of_candidates,
                 double allowed_range,double *best_error)

{
  double dVar1;
  int i;
  double tmp;
  double best_f0;
  double *best_error_local;
  double allowed_range_local;
  int number_of_candidates_local;
  double *f0_candidates_local;
  double reference_f0_local;
  
  best_f0 = 0.0;
  *best_error = allowed_range;
  for (i = 0; i < number_of_candidates; i = i + 1) {
    dVar1 = ABS(reference_f0 - f0_candidates[i]) / reference_f0;
    if (dVar1 < *best_error || dVar1 == *best_error) {
      best_f0 = f0_candidates[i];
      *best_error = dVar1;
    }
  }
  return best_f0;
}

Assistant:

static double SelectBestF0(double reference_f0, const double *f0_candidates,
    int number_of_candidates, double allowed_range, double *best_error) {
  double best_f0 = 0.0;
  *best_error = allowed_range;

  double tmp;
  for (int i = 0; i < number_of_candidates; ++i) {
    tmp = fabs(reference_f0 - f0_candidates[i]) / reference_f0;
    if (tmp > *best_error) continue;
    best_f0 = f0_candidates[i];
    *best_error = tmp;
  }

  return best_f0;
}